

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::DeadReckoningParameter::Encode(DeadReckoningParameter *this,KDataStream *stream)

{
  KUINT16 i;
  long lVar1;
  
  KDataStream::Write(stream,this->m_ui8DeadRecknoningAlgorithm);
  lVar1 = 0;
  do {
    KDataStream::Write(stream,this->m_OtherParams[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf);
  (*(this->m_LinearAcceleration).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_LinearAcceleration,stream);
  (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AngularVelocity,stream);
  return;
}

Assistant:

void DeadReckoningParameter::Encode( KDataStream & stream ) const
{
    stream << m_ui8DeadRecknoningAlgorithm;

    for( KUINT16 i = 0; i < 15; ++i )
    {
        stream << m_OtherParams[i];
    }

    stream << KDIS_STREAM m_LinearAcceleration
           << KDIS_STREAM m_AngularVelocity;
}